

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.h
# Opt level: O0

void __thiscall
hedg::Rest_Client::
send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
          (Rest_Client *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_market_catalogue
          *f,market_catalogue *p)

{
  market_catalogue mVar1;
  undefined8 in_stack_fffffffffffffdf8;
  market_catalogue *pmVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_stack_fffffffffffffe20 [248];
  undefined1 auVar9 [32];
  string_view local_b0;
  undefined1 local_a0 [8];
  request<http::string_body> req;
  market_catalogue *p_local;
  _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_market_catalogue
  *f_local;
  Rest_Client *this_local;
  
  pmVar2 = p;
  req.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._8_8_ = p;
  boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_b0,&p->end_point);
  boost::beast::http::
  message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::message<int,void>((message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
                       *)local_a0,post,local_b0,0xb);
  params::market_catalogue::market_catalogue((market_catalogue *)&stack0xfffffffffffffe30,pmVar2);
  mVar1.session_id._M_string_length = (size_type)p;
  mVar1.session_id._0_8_ = in_stack_fffffffffffffdf8;
  mVar1.session_id.field_2._M_allocated_capacity = (size_type)this;
  mVar1.session_id.field_2._8_8_ = pmVar2;
  mVar1.start_time._0_8_ = f;
  auVar3 = in_stack_fffffffffffffe20._24_32_;
  auVar4 = in_stack_fffffffffffffe20._56_32_;
  auVar5 = in_stack_fffffffffffffe20._88_32_;
  auVar6 = in_stack_fffffffffffffe20._120_32_;
  auVar7 = in_stack_fffffffffffffe20._152_32_;
  auVar8 = in_stack_fffffffffffffe20._184_32_;
  auVar9 = in_stack_fffffffffffffe20._216_32_;
  mVar1.start_time._M_string_length = in_stack_fffffffffffffe20._0_8_;
  mVar1.start_time.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )in_stack_fffffffffffffe20._8_16_;
  mVar1.end_time._M_dataplus = (_Alloc_hider)auVar3[0];
  mVar1.end_time._1_7_ = auVar3._1_7_;
  mVar1.end_time._M_string_length = auVar3._8_8_;
  mVar1.end_time.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar3._16_16_;
  mVar1.end_point._M_dataplus = (_Alloc_hider)auVar4[0];
  mVar1.end_point._1_7_ = auVar4._1_7_;
  mVar1.end_point._M_string_length = auVar4._8_8_;
  mVar1.end_point.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar4._16_16_;
  mVar1.event_type_ids._M_dataplus = (_Alloc_hider)auVar5[0];
  mVar1.event_type_ids._1_7_ = auVar5._1_7_;
  mVar1.event_type_ids._M_string_length = auVar5._8_8_;
  mVar1.event_type_ids.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar5._16_16_;
  mVar1.market_type_codes._M_dataplus = (_Alloc_hider)auVar6[0];
  mVar1.market_type_codes._1_7_ = auVar6._1_7_;
  mVar1.market_type_codes._M_string_length = auVar6._8_8_;
  mVar1.market_type_codes.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar6._16_16_;
  mVar1.max_results._M_dataplus = (_Alloc_hider)auVar7[0];
  mVar1.max_results._1_7_ = auVar7._1_7_;
  mVar1.max_results._M_string_length = auVar7._8_8_;
  mVar1.max_results.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar7._16_16_;
  mVar1.market_projection._M_dataplus = (_Alloc_hider)auVar8[0];
  mVar1.market_projection._1_7_ = auVar8._1_7_;
  mVar1.market_projection._M_string_length = auVar8._8_8_;
  mVar1.market_projection.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar8._16_16_;
  mVar1.market_countries._M_dataplus = (_Alloc_hider)auVar9[0];
  mVar1.market_countries._1_7_ = auVar9._1_7_;
  mVar1.market_countries._M_string_length = auVar9._8_8_;
  mVar1.market_countries.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar9._16_16_;
  (*f)((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
        *)local_a0,mVar1);
  params::market_catalogue::~market_catalogue((market_catalogue *)&stack0xfffffffffffffe30);
  boost::beast::http::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (&(this->super_Client<hedg::Rest_Client>).sock_,
             (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_a0);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_a0);
  return;
}

Assistant:

void send(void(*f)(Buff&, T), T p) {
		http::request<http::string_body> req{ http::verb::post, p.end_point, 11 };
		f(req, p);
		http::write(sock_, req);
	}